

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O2

void __thiscall chrono::ChBody::VariablesQbIncrementPosition(ChBody *this,double dt_step)

{
  int iVar1;
  double dVar2;
  double dVar3;
  ChQuaternion<double> local_100;
  ChQuaternion<double> local_e0;
  ChVector<double> newwel_abs;
  ChVector<double> newspeed;
  ChVector<double> newwel;
  ChQuaternion<double> mnewrot;
  
  iVar1 = (*(this->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
  if ((char)iVar1 != '\0') {
    ChVariables::Get_qb((ChVectorRef *)&local_100,(ChVariables *)&this->variables);
    Eigen::
    VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
    VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
                 *)&local_e0,
                (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)&local_100
                ,0,3);
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&newspeed,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&local_e0,(type *)0x0);
    ChVariables::Get_qb((ChVectorRef *)&local_100,(ChVariables *)&this->variables);
    Eigen::
    VectorBlock<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_-1>::
    VectorBlock((VectorBlock<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1>
                 *)&local_e0,
                (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)&local_100
                ,3,3);
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&newwel,(MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                        *)&local_e0,(type *)0x0);
    dVar2 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
            m_data[2];
    dVar3 = (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
            m_data[1];
    (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.m_data[0]
         = dt_step * newspeed.m_data[0] +
           (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
           m_data[0];
    (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.m_data[1]
         = dt_step * newspeed.m_data[1] + dVar3;
    (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.m_data[2]
         = dt_step * newspeed.m_data[2] + dVar2;
    local_100.m_data[0] =
         (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot.
         m_data[0];
    local_100.m_data[1] =
         (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot.
         m_data[1];
    local_100.m_data[2] =
         (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot.
         m_data[2];
    local_100.m_data[3] =
         (this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.rot.
         m_data[3];
    ChMatrix33<double>::operator*
              (&(this->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.Amatrix,
               &newwel);
    dVar2 = ChVector<double>::Length(&newwel_abs);
    ChVector<double>::Normalize(&newwel_abs);
    dVar2 = dVar2 * dt_step * 0.5;
    dVar3 = sin(dVar2);
    local_e0.m_data[0] = cos(dVar2);
    local_e0.m_data[1] = dVar3 * newwel_abs.m_data[0];
    local_e0.m_data[2] = dVar3 * newwel_abs.m_data[1];
    local_e0.m_data[3] = dVar3 * newwel_abs.m_data[2];
    ChQuaternion<double>::operator%(&mnewrot,&local_e0,&local_100);
    ChFrame<double>::SetRot((ChFrame<double> *)&this->super_ChBodyFrame,&mnewrot);
  }
  return;
}

Assistant:

void ChBody::VariablesQbIncrementPosition(double dt_step) {
    if (!this->IsActive())
        return;

    // Updates position with incremental action of speed contained in the
    // 'qb' vector:  pos' = pos + dt * speed   , like in an Eulero step.

    ChVector<> newspeed(variables.Get_qb().segment(0, 3));
    ChVector<> newwel(variables.Get_qb().segment(3, 3));

    // ADVANCE POSITION: pos' = pos + dt * vel
    this->SetPos(this->GetPos() + newspeed * dt_step);

    // ADVANCE ROTATION: rot' = [dt*wwel]%rot  (use quaternion for delta rotation)
    ChQuaternion<> mdeltarot;
    ChQuaternion<> moldrot = this->GetRot();
    ChVector<> newwel_abs = Amatrix * newwel;
    double mangle = newwel_abs.Length() * dt_step;
    newwel_abs.Normalize();
    mdeltarot.Q_from_AngAxis(mangle, newwel_abs);
    ChQuaternion<> mnewrot = mdeltarot % moldrot;
    this->SetRot(mnewrot);
}